

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo<std::__cxx11::string>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadata *metadata,char *ptr,ParseContext *ctx)

{
  int value_17;
  uint32_t uVar1;
  void *pvVar2;
  char *pcVar3;
  LogMessage *other;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  MessageLite *local_180;
  MessageLite *local_178;
  string *local_170;
  MessageLite *value_16;
  uint32_t tag;
  MessageLite *value_15;
  int size;
  string *value_14;
  ulong uStack_100;
  int value_13;
  uint64_t val_2;
  double value_12;
  long lStack_e8;
  float value_11;
  long value_10;
  unsigned_long uStack_d8;
  int value_9;
  unsigned_long value_8;
  int64_t iStack_c8;
  uint value_7;
  int64_t value_6;
  uint64_t val_1;
  uint32_t uStack_b0;
  int32_t value_5;
  uint64_t val;
  uint64_t value_4;
  uint64_t value_3;
  uint64_t value_2;
  uint64_t value_1;
  uint64_t value;
  LogMessage local_70;
  ExtensionSet *local_38;
  char *ptr_local;
  InternalMetadata *metadata_local;
  ExtensionInfo *extension_local;
  bool was_packed_on_wire_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  local_38 = (ExtensionSet *)ptr;
  ptr_local = (char *)metadata;
  metadata_local = (InternalMetadata *)extension;
  extension_local._3_1_ = was_packed_on_wire;
  extension_local._4_4_ = number;
  pEStack_18 = this;
  if (was_packed_on_wire) {
    switch(extension->type) {
    case '\x01':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedDoubleParser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x02':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedFloatParser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x03':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedInt64Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x04':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedUInt64Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x05':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedInt32Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x06':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedFixed64Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\a':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedFixed32Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\b':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedBoolParser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x4f);
      other = LogMessage::operator<<(&local_70,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=((LogFinisher *)((long)&value + 3),other);
      LogMessage::~LogMessage(&local_70);
      break;
    case '\r':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedUInt32Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x0e':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedEnumParserArg<std::__cxx11::string>
                         (pvVar2,(char *)local_38,ctx,
                          (EnumValidityFuncWithArg *)metadata_local[2].ptr_,
                          (void *)metadata_local[3].ptr_,(InternalMetadata *)ptr_local,
                          extension_local._4_4_);
      return pcVar3;
    case '\x0f':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedSFixed32Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x10':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedSFixed64Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x11':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedSInt32Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    case '\x12':
      pvVar2 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar3 = PackedSInt64Parser(pvVar2,(char *)local_38,ctx);
      return pcVar3;
    }
  }
  else {
    switch(extension->type) {
    case '\x01':
      val_2 = (uint64_t)UnalignedLoad<double>(ptr);
      local_38 = (ExtensionSet *)&local_38->flat_capacity_;
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetDouble(this,extension_local._4_4_,'\x01',(double)val_2,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddDouble(this,extension_local._4_4_,'\x01',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),(double)val_2,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x02':
      value_12._4_4_ = UnalignedLoad<float>(ptr);
      local_38 = (ExtensionSet *)((long)&local_38->arena_ + 4);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetFloat(this,extension_local._4_4_,'\x02',value_12._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddFloat(this,extension_local._4_4_,'\x02',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_12._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x03':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_2);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x03',value_2,(FieldDescriptor *)metadata_local[4].ptr_
                );
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x03',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_2,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x04':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_4);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x04',value_4,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x04',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_4,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x05':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_1);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x05',(int32_t)value_1,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x05',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),(int32_t)value_1,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x06':
      uStack_d8 = UnalignedLoad<unsigned_long>(ptr);
      local_38 = (ExtensionSet *)&local_38->flat_capacity_;
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x06',uStack_d8,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x06',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),uStack_d8,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\a':
      value_8._4_4_ = UnalignedLoad<unsigned_int>(ptr);
      local_38 = (ExtensionSet *)((long)&local_38->arena_ + 4);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt32(this,extension_local._4_4_,'\a',value_8._4_4_,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\a',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_8._4_4_,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\b':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&val);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetBool(this,extension_local._4_4_,'\b',val != 0,(FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddBool(this,extension_local._4_4_,'\b',
                (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),val != 0,
                (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\t':
    case '\f':
      if ((extension->is_repeated & 1U) == 0) {
        local_170 = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      else {
        local_170 = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      uVar1 = ReadSize((char **)&local_38);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      pcVar3 = EpsCopyInputStream::ReadString
                         (&ctx->super_EpsCopyInputStream,(char *)local_38,uVar1,local_170);
      return pcVar3;
    case '\n':
      if ((extension->is_repeated & 1U) == 0) {
        local_178 = MutableMessage(this,number,'\n',
                                   (MessageLite *)(extension->field_5).enum_validity_check.func,
                                   extension->descriptor);
      }
      else {
        local_178 = AddMessage(this,number,'\n',
                               (MessageLite *)(extension->field_5).enum_validity_check.func,
                               extension->descriptor);
      }
      pcVar3 = ParseContext::ParseGroup<google::protobuf::MessageLite>
                         (ctx,local_178,(char *)local_38,extension_local._4_4_ * 8 + 3);
      return pcVar3;
    case '\v':
      if ((extension->is_repeated & 1U) == 0) {
        local_180 = MutableMessage(this,number,'\v',
                                   (MessageLite *)(extension->field_5).enum_validity_check.func,
                                   extension->descriptor);
      }
      else {
        local_180 = AddMessage(this,number,'\v',
                               (MessageLite *)(extension->field_5).enum_validity_check.func,
                               extension->descriptor);
      }
      pcVar3 = ParseContext::ParseMessage(ctx,local_180,(char *)local_38);
      return pcVar3;
    case '\r':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_3);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt32(this,extension_local._4_4_,'\r',(uint32_t)value_3,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\r',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),(uint32_t)value_3,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x0e':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&stack0xffffffffffffff00);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      value_17 = (int)uStack_100;
      uVar4 = (*(code *)metadata_local[2].ptr_)(metadata_local[3].ptr_,uStack_100 & 0xffffffff);
      uVar1 = extension_local._4_4_;
      if ((uVar4 & 1) == 0) {
        s = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>
                      ((InternalMetadata *)ptr_local);
        WriteVarint(uVar1,uStack_100,s);
      }
      else if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetEnum(this,extension_local._4_4_,'\x0e',value_17,(FieldDescriptor *)metadata_local[4].ptr_
               );
      }
      else {
        AddEnum(this,extension_local._4_4_,'\x0e',
                (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_17,
                (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x0f':
      value_10._4_4_ = UnalignedLoad<int>(ptr);
      local_38 = (ExtensionSet *)((long)&local_38->arena_ + 4);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x0f',value_10._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x0f',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_10._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x10':
      lStack_e8 = UnalignedLoad<long>(ptr);
      local_38 = (ExtensionSet *)&local_38->flat_capacity_;
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x10',lStack_e8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x10',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),lStack_e8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x11':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,(unsigned_long *)&uStack_b0);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      val_1._4_4_ = WireFormatLite::ZigZagDecode32(uStack_b0);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x11',val_1._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x11',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),val_1._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x12':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,(unsigned_long *)&value_6);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      iStack_c8 = WireFormatLite::ZigZagDecode64(value_6);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x12',iStack_c8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x12',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),iStack_c8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
    }
  }
  return (char *)local_38;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    InternalMetadata* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg<T>(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check.func,
            extension.enum_validity_check.arg, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t value;                                                         \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
      HANDLE_VARINT_TYPE(BOOL, Bool);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t val;                                                           \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = val;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          WriteVarint(number, val, metadata->mutable_unknown_fields<T>());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32_t tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}